

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O3

void __thiscall enact::UnaryExpr::~UnaryExpr(UnaryExpr *this)

{
  ~UnaryExpr(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

~UnaryExpr() override = default;